

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O2

int testSystemTools(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  FileTypeEnum FVar33;
  FileTypeEnum FVar34;
  FileTypeEnum FVar35;
  FileTypeEnum FVar36;
  int iVar37;
  int iVar38;
  __uid_t _Var39;
  __mode_t __mask;
  int iVar40;
  ostream *poVar41;
  unsigned_long uVar42;
  Status SVar43;
  char *pcVar44;
  size_t sVar45;
  ulong uVar46;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar47;
  string *psVar48;
  size_type size;
  size_type sVar49;
  bool *pbVar50;
  ulong uVar51;
  byte bVar52;
  undefined8 in_R8;
  byte bVar53;
  char *__s;
  long lVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  CopyStatus CVar66;
  initializer_list<const_char_*> expected;
  initializer_list<const_char_*> expected_00;
  initializer_list<const_char_*> expected_01;
  initializer_list<const_char_*> expected_02;
  bool local_59d;
  string testDotFile;
  string testBinFile;
  mode_t thisPerm;
  string testNewDir;
  string testNewFile;
  string testTxtFile;
  byte local_4ac;
  ostream *local_4a8;
  byte local_4a0;
  string testFileMissing;
  mode_t origPerm;
  string testNonExistingFile;
  Stat_t buf;
  string testBadSymlink;
  string testFileMissingDir;
  Status symlinkStatus;
  string output;
  string testBadSymlinkTgt;
  string local_50;
  
  local_59d = true;
  for (lVar54 = 8; lVar54 != 0xf8; lVar54 = lVar54 + 0x10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,*(char **)((long)&cmakeGeneratedFunctionMapEntries[0xb].func + lVar54)
               ,(allocator<char> *)&testDotFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testNonExistingFile,*(char **)((long)toUnixPaths[0] + lVar54),
               (allocator<char> *)&testBinFile);
    bVar6 = CheckConvertToUnixSlashes((string *)&buf,&testNonExistingFile);
    local_59d = bVar6 && local_59d != false;
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&buf);
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  bVar6 = cmsys::SystemTools::GetEnv("HOME",&output);
  if (bVar6) {
    std::__cxx11::string::append((char *)&output);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"~/foo bar/lala",(allocator<char> *)&testNonExistingFile);
    bVar6 = CheckConvertToUnixSlashes((string *)&buf,&output);
    local_59d = bVar6 && local_59d != false;
    std::__cxx11::string::~string((string *)&buf);
  }
  local_4a8 = (ostream *)&std::cerr;
  for (lVar54 = 0; lVar54 != 0x40; lVar54 = lVar54 + 0x20) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testNonExistingFile,*(char **)((long)checkEscapeChars[0] + lVar54),
               (allocator<char> *)&testBinFile);
    pcVar44 = *(char **)((long)checkEscapeChars[0] + lVar54 + 8);
    cVar2 = **(char **)((long)checkEscapeChars[0] + lVar54 + 0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testDotFile,*(char **)((long)checkEscapeChars[0] + lVar54 + 0x18),
               (allocator<char> *)&testTxtFile);
    cmsys::SystemTools::EscapeChars_abi_cxx11_
              ((string *)&buf,(SystemTools *)testNonExistingFile._M_dataplus._M_p,pcVar44,
               (char *)(ulong)(uint)(int)cVar2,(char)in_R8);
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &buf,&testDotFile);
    if (bVar6) {
      poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with CheckEscapeChars - input: ");
      poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
      poVar41 = std::operator<<(poVar41," output: ");
      poVar41 = std::operator<<(poVar41,(string *)&buf);
      poVar41 = std::operator<<(poVar41," expected: ");
      poVar41 = std::operator<<(poVar41,(string *)&testDotFile);
      std::endl<char,std::char_traits<char>>(poVar41);
    }
    std::__cxx11::string::~string((string *)&buf);
    local_59d = (bool)(local_59d & !bVar6);
    std::__cxx11::string::~string((string *)&testDotFile);
    std::__cxx11::string::~string((string *)&testNonExistingFile);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/kwsys/testSystemToolsNonExistingFile"
             ,(allocator<char> *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/kwsys/."
             ,(allocator<char> *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testBinFile,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/kwsys/testSystemTools.bin"
             ,(allocator<char> *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testTxtFile,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/kwsys/testSystemTools.cxx"
             ,(allocator<char> *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNewDir,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O2/Source/kwsys/testSystemToolsNewDir"
             ,(allocator<char> *)&buf);
  std::operator+(&testNewFile,&testNewDir,"/testNewFile.txt");
  FVar33 = cmsys::SystemTools::DetectFileType(testNonExistingFile._M_dataplus._M_p,0x100,0.05);
  if (FVar33 != FileTypeUnknown) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  FVar34 = cmsys::SystemTools::DetectFileType(testDotFile._M_dataplus._M_p,0x100,0.05);
  if (FVar34 != FileTypeUnknown) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar41 = std::operator<<(poVar41,(string *)&testDotFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  FVar35 = cmsys::SystemTools::DetectFileType(testBinFile._M_dataplus._M_p,0x100,0.05);
  if (FVar35 != FileTypeBinary) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar41 = std::operator<<(poVar41,(string *)&testBinFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  FVar36 = cmsys::SystemTools::DetectFileType(testTxtFile._M_dataplus._M_p,0x100,0.05);
  if (FVar36 != FileTypeText) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar41 = std::operator<<(poVar41,(string *)&testTxtFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  uVar42 = cmsys::SystemTools::FileLength(&testBinFile);
  if (uVar42 != 0x2fe) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileLength - incorrect length for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testBinFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  iVar37 = cmsys::SystemTools::Stat(testTxtFile._M_dataplus._M_p,&buf);
  if (iVar37 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Stat - unable to stat text file: "
                             );
    poVar41 = std::operator<<(poVar41,(string *)&testTxtFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  iVar38 = cmsys::SystemTools::Stat(&testBinFile,&buf);
  if (iVar38 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Stat - unable to stat bin file: ")
    ;
    poVar41 = std::operator<<(poVar41,(string *)&testBinFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::MakeDirectory(&testNewDir,(mode_t *)0x0);
  bVar6 = SVar43.Kind_ != Success;
  if (bVar6) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with MakeDirectory for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::MakeDirectory(&testNewDir,(mode_t *)0x0);
  bVar55 = SVar43.Kind_ != Success;
  if (bVar55) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with second call to MakeDirectory for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::MakeDirectory((char *)0x0,(mode_t *)0x0);
  bVar56 = SVar43.Kind_ == Success;
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with MakeDirectory(0)");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  paVar1 = &testFileMissing.field_2;
  testFileMissing._M_string_length = 0;
  testFileMissing.field_2._M_local_buf[0] = '\0';
  testFileMissing._M_dataplus._M_p = (pointer)paVar1;
  SVar43 = cmsys::SystemTools::MakeDirectory(&testFileMissing,(mode_t *)0x0);
  std::__cxx11::string::~string((string *)&testFileMissing);
  bVar57 = SVar43.Kind_ == Success;
  if (bVar57) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with MakeDirectory(std::string())");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar7 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,false);
  if (!bVar7) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and not file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar8 = cmsys::SystemTools::PathExists(&testNewDir);
  if (!bVar8) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::RemoveADirectory(&testNewDir);
  bVar58 = SVar43.Kind_ != Success;
  if (bVar58) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveADirectory for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar9 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,false);
  if (bVar9) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"After RemoveADirectory: ");
    poVar41 = std::operator<<(poVar41,"Problem with FileExists as C string and not file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar10 = cmsys::SystemTools::PathExists(&testNewDir);
  if (bVar10) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"After RemoveADirectory: ");
    poVar41 = std::operator<<(poVar41,"Problem with PathExists for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::MakeDirectory(testNewDir._M_dataplus._M_p,(mode_t *)0x0);
  bVar59 = SVar43.Kind_ != Success;
  if (bVar59) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with second call to MakeDirectory as C string for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::Touch(&testNewFile,true);
  bVar60 = SVar43.Kind_ != Success;
  if (bVar60) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Touch for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::MakeDirectory(&testNewFile,(mode_t *)0x0);
  bVar61 = SVar43.Kind_ == Success;
  if (bVar61) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with to MakeDirectory for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar11 = cmsys::SystemTools::FileExists((char *)0x0);
  if (bVar11) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists(0)");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar12 = cmsys::SystemTools::FileExists((char *)0x0,true);
  if (bVar12) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists(0) as file");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  testFileMissing._M_string_length = 0;
  testFileMissing.field_2._M_local_buf[0] = '\0';
  testFileMissing._M_dataplus._M_p = (pointer)paVar1;
  bVar13 = cmsys::SystemTools::FileExists(&testFileMissing);
  std::__cxx11::string::~string((string *)&testFileMissing);
  if (bVar13) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists(std::string())");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar14 = cmsys::SystemTools::FileExists(&testNewDir,true);
  if (bVar14) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar15 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,true);
  if (bVar15) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar16 = cmsys::SystemTools::FileExists(&testNewDir,false);
  if (!bVar16) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as not file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar17 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,false);
  if (!bVar17) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and not file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar18 = cmsys::SystemTools::FileExists(&testNewFile);
  if (!bVar18) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar19 = cmsys::SystemTools::FileExists(testNewFile._M_dataplus._M_p);
  if (!bVar19) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as C string for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar20 = cmsys::SystemTools::FileExists(&testNewFile,true);
  if (!bVar20) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar21 = cmsys::SystemTools::FileExists(testNewFile._M_dataplus._M_p,true);
  if (!bVar21) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and file for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  testFileMissing._M_string_length = 0;
  testFileMissing.field_2._M_local_buf[0] = '\0';
  testFileMissing._M_dataplus._M_p = (pointer)paVar1;
  bVar22 = cmsys::SystemTools::PathExists(&testFileMissing);
  std::__cxx11::string::~string((string *)&testFileMissing);
  if (bVar22) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists(std::string())");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar23 = cmsys::SystemTools::PathExists(&testNewDir);
  if (!bVar23) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar24 = cmsys::SystemTools::PathExists(&testNewFile);
  if (!bVar24) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  *(uint *)(close + *(long *)(std::cerr + -0x18)) =
       *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 0x40;
  SVar43 = cmsys::SystemTools::GetPermissions(&testNewFile,&origPerm);
  bVar62 = SVar43.Kind_ != Success;
  if (bVar62) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (1) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::SetPermissions(&testNewFile,0x100,false);
  bVar63 = SVar43.Kind_ != Success;
  if (bVar63) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (1) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  SVar43 = cmsys::SystemTools::GetPermissions(&testNewFile,&thisPerm);
  bVar64 = SVar43.Kind_ != Success;
  if (bVar64) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (2) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar65 = (thisPerm & 0x1ff) != 0x100;
  if (bVar65) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "SetPermissions failed to set permissions (1) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    poVar41 = std::operator<<(poVar41,": actual = ");
    poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
    poVar41 = std::operator<<(poVar41,"; expected = ");
    poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar6 = !bVar65 &&
          (!bVar64 &&
          (!bVar63 &&
          (!bVar62 &&
          (bVar24 &&
          (bVar23 &&
          (!bVar22 &&
          (bVar21 &&
          (bVar20 &&
          (bVar19 &&
          (bVar18 &&
          (bVar17 &&
          (bVar16 &&
          (!bVar15 &&
          (!bVar14 &&
          (!bVar13 &&
          (!bVar12 &&
          (!bVar11 &&
          (!bVar61 &&
          (!bVar60 &&
          (!bVar59 &&
          (!bVar10 &&
          (!bVar9 &&
          (!bVar58 &&
          (bVar8 && (bVar7 && (!bVar57 &&
                              (!bVar56 &&
                              (!bVar55 &&
                              (!bVar6 &&
                              (iVar38 == 0 &&
                              (iVar37 == 0 &&
                              (uVar42 == 0x2fe &&
                              (FVar36 == FileTypeText &&
                              (FVar35 == FileTypeBinary &&
                              (FVar34 == FileTypeUnknown && FVar33 == FileTypeUnknown)))))))))))))))
          ))))))))))))))))))));
  _Var39 = getuid();
  if ((_Var39 != 0) && (bVar55 = cmsys::SystemTools::TestFileAccess(&testNewFile,2), bVar55)) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "TestFileAccess incorrectly indicated that this is a writable file:");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  bVar55 = cmsys::SystemTools::TestFileAccess(&testNewFile,0);
  if (!bVar55) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "TestFileAccess incorrectly indicated that this file does not exist:")
    ;
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  SVar43 = cmsys::SystemTools::SetPermissions(&testNewFile,0x1ff,false);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (2) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  SVar43 = cmsys::SystemTools::GetPermissions(&testNewFile,&thisPerm);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (3) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  if ((~thisPerm & 0x1ff) != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "SetPermissions failed to set permissions (2) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    poVar41 = std::operator<<(poVar41,": actual = ");
    poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
    poVar41 = std::operator<<(poVar41,"; expected = ");
    poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  __mask = umask(0x1ff);
  SVar43 = cmsys::SystemTools::SetPermissions(&testNewFile,0x1ff,true);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (3) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  SVar43 = cmsys::SystemTools::GetPermissions(&testNewFile,&thisPerm);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (4) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  if (((ushort)thisPerm & 0x1ff) != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"SetPermissions failed to honor umask for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    poVar41 = std::operator<<(poVar41,": actual = ");
    poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
    poVar41 = std::operator<<(poVar41,"; expected = ");
    poVar41 = (ostream *)std::ostream::operator<<(poVar41,0);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  umask(__mask);
  SVar43 = cmsys::SystemTools::SetPermissions(&testNewFile,origPerm,false);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (4) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  SVar43 = cmsys::SystemTools::RemoveFile(&testNewFile);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveFile: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  std::operator+(&testFileMissing,&testNewDir,"/testMissingFile.txt");
  SVar43 = cmsys::SystemTools::RemoveFile(&testFileMissing);
  if (SVar43.Kind_ != Success) {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar41 = std::operator<<((ostream *)&std::cerr,"RemoveFile(\"");
    poVar41 = std::operator<<(poVar41,(string *)&testFileMissing);
    poVar41 = std::operator<<(poVar41,"\") failed: ");
    poVar41 = std::operator<<(poVar41,(string *)&testFileMissingDir);
    std::operator<<(poVar41,"\n");
    std::__cxx11::string::~string((string *)&testFileMissingDir);
    bVar6 = false;
  }
  std::operator+(&testFileMissingDir,&testNewDir,"/missing/file.txt");
  SVar43 = cmsys::SystemTools::RemoveFile(&testFileMissingDir);
  if (SVar43.Kind_ != Success) {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar41 = std::operator<<((ostream *)&std::cerr,"RemoveFile(\"");
    poVar41 = std::operator<<(poVar41,(string *)&testFileMissingDir);
    poVar41 = std::operator<<(poVar41,"\") failed: ");
    poVar41 = std::operator<<(poVar41,(string *)&testBadSymlink);
    std::operator<<(poVar41,"\n");
    std::__cxx11::string::~string((string *)&testBadSymlink);
    bVar6 = false;
  }
  std::operator+(&testBadSymlink,&testNewDir,"/badSymlink.txt");
  std::operator+(&testBadSymlinkTgt,&testNewDir,"/missing/symlinkTgt.txt");
  symlinkStatus = cmsys::SystemTools::CreateSymlink(&testBadSymlinkTgt,&testBadSymlink);
  if (symlinkStatus.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"CreateSymlink for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testBadSymlink);
    poVar41 = std::operator<<(poVar41," -> ");
    poVar41 = std::operator<<(poVar41,(string *)&testBadSymlinkTgt);
    poVar41 = std::operator<<(poVar41," failed: ");
    cmsys::Status::GetString_abi_cxx11_(&local_50,&symlinkStatus);
    poVar41 = std::operator<<(poVar41,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar41);
    std::__cxx11::string::~string((string *)&local_50);
    bVar6 = false;
  }
  SVar43 = cmsys::SystemTools::Touch(&testBadSymlink,false);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Touch (no create) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testBadSymlink);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  SVar43 = cmsys::SystemTools::Touch(&testNewDir,false);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Touch (no create) for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  cmsys::SystemTools::Touch(&testNewFile,true);
  SVar43 = cmsys::SystemTools::RemoveADirectory(&testNewDir);
  if (SVar43.Kind_ != Success) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveADirectory for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar6 = false;
  }
  *(uint *)(close + *(long *)(std::cerr + -0x18)) =
       *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 2;
  std::__cxx11::string::~string((string *)&testBadSymlinkTgt);
  std::__cxx11::string::~string((string *)&testBadSymlink);
  std::__cxx11::string::~string((string *)&testFileMissingDir);
  std::__cxx11::string::~string((string *)&testFileMissing);
  std::__cxx11::string::~string((string *)&testNewFile);
  std::__cxx11::string::~string((string *)&testNewDir);
  std::__cxx11::string::~string((string *)&testTxtFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"mary had a little lamb.",(allocator<char> *)&buf);
  cmsys::SystemTools::CapitalizedWords((string *)&buf,&testNonExistingFile);
  bVar55 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf
                           ,"Mary Had A Little Lamb.");
  std::__cxx11::string::~string((string *)&buf);
  if (bVar55) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with CapitalizedWords ");
    poVar41 = std::operator<<(poVar41,'\"');
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    poVar41 = std::operator<<(poVar41,'\"');
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  std::__cxx11::string::assign((char *)&testNonExistingFile);
  cmsys::SystemTools::UnCapitalizedWords((string *)&buf,&testNonExistingFile);
  bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf
                           ,"mary had a little lamb.");
  std::__cxx11::string::~string((string *)&buf);
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with UnCapitalizedWords ");
    poVar41 = std::operator<<(poVar41,'\"');
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    poVar41 = std::operator<<(poVar41,'\"');
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  std::__cxx11::string::assign((char *)&testNonExistingFile);
  cmsys::SystemTools::AddSpaceBetweenCapitalizedWords((string *)&buf,&testNonExistingFile);
  bVar57 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf
                           ,"Mary Had The Little Lamb.");
  std::__cxx11::string::~string((string *)&buf);
  if (bVar57) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with AddSpaceBetweenCapitalizedWords ")
    ;
    poVar41 = std::operator<<(poVar41,'\"');
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    poVar41 = std::operator<<(poVar41,'\"');
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  pcVar44 = cmsys::SystemTools::AppendStrings("Mary Had A"," Little Lamb.");
  iVar37 = strcmp(pcVar44,"Mary Had A Little Lamb.");
  if (iVar37 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with AppendStrings ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A\" \" Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  if (pcVar44 != (char *)0x0) {
    operator_delete__(pcVar44);
  }
  pcVar44 = cmsys::SystemTools::AppendStrings("Mary Had"," A ","Little Lamb.");
  iVar38 = strcmp(pcVar44,"Mary Had A Little Lamb.");
  if (iVar38 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with AppendStrings ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had\" \" A \" \"Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  if (pcVar44 != (char *)0x0) {
    operator_delete__(pcVar44);
  }
  sVar45 = cmsys::SystemTools::CountChar("Mary Had A Little Lamb.",'a');
  if (sVar45 != 3) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with CountChar ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  pcVar44 = cmsys::SystemTools::RemoveChars("Mary Had A Little Lamb.","aeiou");
  iVar40 = strcmp(pcVar44,"Mry Hd A Lttl Lmb.");
  if (iVar40 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveChars ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  bVar55 = iVar40 == 0 &&
           (sVar45 == 3 && (iVar38 == 0 && (iVar37 == 0 && (!bVar57 && (!bVar56 && !bVar55)))));
  if (pcVar44 != (char *)0x0) {
    operator_delete__(pcVar44);
  }
  pcVar44 = cmsys::SystemTools::RemoveCharsButUpperHex("Mary Had A Little Lamb.");
  if ((*pcVar44 != 'A') || (pcVar44[1] != '\0')) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveCharsButUpperHex ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  operator_delete__(pcVar44);
  pcVar44 = strdup("Mary Had A Little Lamb.");
  cmsys::SystemTools::ReplaceChars(pcVar44,"aeiou",'X');
  iVar37 = strcmp(pcVar44,"MXry HXd A LXttlX LXmb.");
  if (iVar37 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with ReplaceChars ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  free(pcVar44);
  bVar56 = cmsys::SystemTools::StringStartsWith("Mary Had A Little Lamb.","Mary ");
  if (!bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with StringStartsWith ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  bVar56 = cmsys::SystemTools::StringEndsWith("Mary Had A Little Lamb."," Lamb.");
  if (!bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with StringEndsWith ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  pcVar44 = cmsys::SystemTools::DuplicateString("Mary Had A Little Lamb.");
  iVar37 = strcmp(pcVar44,"Mary Had A Little Lamb.");
  if (iVar37 != 0) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with DuplicateString ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  if (pcVar44 != (char *)0x0) {
    operator_delete__(pcVar44);
  }
  std::__cxx11::string::assign((char *)&testNonExistingFile);
  cmsys::SystemTools::CropString((string *)&buf,&testNonExistingFile,0xd);
  bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf
                           ,"Mary ...Lamb.");
  std::__cxx11::string::~string((string *)&buf);
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with CropString ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  testTxtFile._M_dataplus._M_p = (pointer)0x0;
  testTxtFile._M_string_length = 0;
  testTxtFile.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Mary Had A Little Lamb.",(allocator<char> *)&testDotFile);
  cmsys::SystemTools::Split
            ((string *)&buf,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testTxtFile,' ');
  std::__cxx11::string::~string((string *)&buf);
  bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           testTxtFile._M_dataplus._M_p,"Mary");
  if ((((bVar56) ||
       (bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(testTxtFile._M_dataplus._M_p + 0x20),"Had"), bVar56)) ||
      (bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(testTxtFile._M_dataplus._M_p + 0x40),"A"), bVar56)) ||
     ((bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(testTxtFile._M_dataplus._M_p + 0x60),"Little"), bVar56 ||
      (bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(testTxtFile._M_dataplus._M_p + 0x80),"Lamb."), bVar56)))) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Split ");
    poVar41 = std::operator<<(poVar41,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Mary",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf.st_gid,"Had",(allocator<char> *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf.st_blocks,"A",(allocator<char> *)&testNewFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf.st_mtim.tv_nsec,"Little",(allocator<char> *)&testFileMissing);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(buf.__glibc_reserved + 1),"Lamb.",(allocator<char> *)&testFileMissingDir);
  __l._M_len = 5;
  __l._M_array = (iterator)&buf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&testNewDir,__l,(allocator_type *)&testBadSymlink);
  lVar54 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)buf.__glibc_reserved + lVar54 + -0x78));
    lVar54 = lVar54 + -0x20;
  } while (lVar54 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile," ",(allocator<char> *)&testBinFile);
  cmsys::SystemTools::Join
            ((string *)&buf,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testNewDir,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  bVar56 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf
                           ,"Mary Had A Little Lamb.");
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Join \"Mary Had A Little Lamb.\"")
    ;
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testBinFile,"L://Local Mojo/Hex Power Pack/Iffy Voodoo",
             (allocator<char> *)&testNewFile);
  cmsys::SystemTools::ConvertToWindowsOutputPath(&testDotFile,&testBinFile);
  bVar56 = std::operator!=(&testDotFile,"\"L:\\Local Mojo\\Hex Power Pack\\Iffy Voodoo\"");
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ");
    poVar41 = std::operator<<(poVar41,"\"L://Local Mojo/Hex Power Pack/Iffy Voodoo\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testBinFile,"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo",
             (allocator<char> *)&testNewFile);
  cmsys::SystemTools::ConvertToWindowsOutputPath(&testDotFile,&testBinFile);
  bVar56 = std::operator!=(&testDotFile,"\"\\\\grayson\\Local Mojo\\Hex Power Pack\\Iffy Voodoo\"");
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ");
    poVar41 = std::operator<<(poVar41,"\"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testBinFile,"//Local Mojo/Hex Power Pack/Iffy Voodoo",
             (allocator<char> *)&testNewFile);
  cmsys::SystemTools::ConvertToUnixOutputPath(&testDotFile,&testBinFile);
  bVar56 = std::operator!=(&testDotFile,"//Local\\ Mojo/Hex\\ Power\\ Pack/Iffy\\ Voodoo");
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  if (bVar56) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToUnixOutputPath ");
    poVar41 = std::operator<<(poVar41,"\"//Local Mojo/Hex Power Pack/Iffy Voodoo\"");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar55 = false;
  }
  std::__cxx11::string::~string((string *)&buf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testNewDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testTxtFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"A=B",(allocator<char> *)&testNonExistingFile);
  bVar57 = CheckPutEnv((string *)&buf,"A","B");
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"B=C",(allocator<char> *)&testNonExistingFile);
  bVar7 = CheckPutEnv((string *)&buf,"B","C");
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"C=D",(allocator<char> *)&testNonExistingFile);
  bVar8 = CheckPutEnv((string *)&buf,"C","D");
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"D=E",(allocator<char> *)&testNonExistingFile);
  bVar58 = CheckPutEnv((string *)&buf,"D","E");
  std::__cxx11::string::~string((string *)&buf);
  bVar9 = CheckUnPutEnv("A","A");
  bVar10 = CheckUnPutEnv("B=","B");
  bVar59 = CheckUnPutEnv("C=D","C");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share",(allocator<char> *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/bin/bash",(allocator<char> *)&testTxtFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,"../../bin/bash",(allocator<char> *)&testNewDir);
  bVar60 = CheckRelativePath((string *)&buf,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/./share/",(allocator<char> *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/bin/bash",(allocator<char> *)&testTxtFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,"../../bin/bash",(allocator<char> *)&testNewDir);
  bVar61 = CheckRelativePath((string *)&buf,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr//share/",(allocator<char> *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/bin/bash",(allocator<char> *)&testTxtFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,"../../bin/bash",(allocator<char> *)&testNewDir);
  bVar11 = CheckRelativePath((string *)&buf,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share/../bin/",(allocator<char> *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/bin/bash",(allocator<char> *)&testTxtFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,"../../bin/bash",(allocator<char> *)&testNewDir);
  bVar12 = CheckRelativePath((string *)&buf,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share",(allocator<char> *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/usr/share//bin",(allocator<char> *)&testTxtFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,"bin",(allocator<char> *)&testNewDir);
  bVar13 = CheckRelativePath((string *)&buf,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share/*",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/usr/share/*",(allocator<char> *)&testBinFile);
  bVar14 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"C:/Windows/*",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"C:/Windows/*",(allocator<char> *)&testBinFile);
  bVar15 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share/../lib",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/usr/lib",(allocator<char> *)&testBinFile);
  bVar16 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share/./lib",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/usr/share/lib",(allocator<char> *)&testBinFile);
  bVar17 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share/../../lib",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/lib",(allocator<char> *)&testBinFile);
  bVar18 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/usr/share/.././../lib",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/lib",(allocator<char> *)&testBinFile);
  bVar19 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/../lib",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/lib",(allocator<char> *)&testBinFile);
  bVar20 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/../lib/",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/lib",(allocator<char> *)&testBinFile);
  bVar21 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/",(allocator<char> *)&testBinFile);
  bVar22 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"C:/",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"C:/",(allocator<char> *)&testBinFile);
  bVar23 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"C:/../",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"C:/",(allocator<char> *)&testBinFile);
  bVar24 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"C:/../../",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"C:/",(allocator<char> *)&testBinFile);
  bVar62 = CheckCollapsePath((string *)&buf,&testNonExistingFile,(char *)0x0);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"../b",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"../../b",(allocator<char> *)&testBinFile);
  bVar63 = CheckCollapsePath((string *)&buf,&testNonExistingFile,"../");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"../a/../b",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"../b",(allocator<char> *)&testBinFile);
  bVar64 = CheckCollapsePath((string *)&buf,&testNonExistingFile,"../rel");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"a/../b",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"../rel/b",(allocator<char> *)&testBinFile);
  bVar65 = CheckCollapsePath((string *)&buf,&testNonExistingFile,"../rel");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  testNewFile._M_dataplus._M_p = "[HKEY_LOCAL_MACHINE\\SOFTWARE\\MyApp; MyKey]";
  testBinFile._M_dataplus._M_p = (pointer)0x0;
  testBinFile._M_string_length = 0;
  testBinFile.field_2._M_allocated_capacity = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testBinFile,
             (char **)&testNewFile);
  testTxtFile._M_dataplus._M_p = (pointer)0x0;
  testTxtFile._M_string_length = 0;
  testTxtFile.field_2._M_allocated_capacity = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testTxtFile,
             (char **)&testNewFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testTxtFile,
             (char (*) [21])"/Somewhere/something");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testTxtFile,
             (char (*) [5])0x12547b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testDotFile,"S",(allocator<char> *)&testNewDir);
  std::operator+(&testNonExistingFile,&testDotFile,"=");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                 &testNonExistingFile,"/Somewhere/something:/tmp");
  bVar56 = CheckPutEnv((string *)&buf,"S","/Somewhere/something:/tmp");
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&testNewDir,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&testBinFile);
  cmsys::SystemTools::GetPath
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testNewDir,"S");
  bVar25 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&testNewDir,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&testTxtFile);
  if (bVar25) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"GetPath(");
    StringVectorToString
              ((string *)&buf,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testBinFile);
    poVar41 = std::operator<<(poVar41,(string *)&buf);
    poVar41 = std::operator<<(poVar41,", ");
    poVar41 = std::operator<<(poVar41,"S");
    poVar41 = std::operator<<(poVar41,")  yielded ");
    StringVectorToString
              (&testNonExistingFile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testNewDir);
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    poVar41 = std::operator<<(poVar41," instead of ");
    StringVectorToString
              (&testDotFile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testTxtFile);
    poVar41 = std::operator<<(poVar41,(string *)&testDotFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    std::__cxx11::string::~string((string *)&testDotFile);
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&buf);
    bVar56 = false;
  }
  bVar25 = CheckUnPutEnv("S","S");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testNewDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testTxtFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testBinFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"testFindFile.txt",(allocator<char> *)&testNonExistingFile);
  std::operator+(&testNonExistingFile,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O2/Source/kwsys/"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf);
  SVar43 = cmsys::SystemTools::Touch(&testNonExistingFile,true);
  if (SVar43.Kind_ == Success) {
    testBinFile._M_dataplus._M_p = (pointer)0x0;
    testBinFile._M_string_length = 0;
    testBinFile.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[94]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testBinFile,
               (char (*) [94])
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O2/Source/kwsys"
              );
    cmsys::SystemTools::FindFile
              (&testDotFile,(string *)&buf,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testBinFile,true);
    sVar49 = testDotFile._M_string_length;
    std::__cxx11::string::~string((string *)&testDotFile);
    if (sVar49 == 0) {
      poVar41 = std::operator<<((ostream *)&std::cerr,
                                "Problem with FindFile without system paths for: ");
      poVar41 = std::operator<<(poVar41,(string *)&buf);
      std::endl<char,std::char_traits<char>>(poVar41);
    }
    cmsys::SystemTools::FindFile
              (&testDotFile,(string *)&buf,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testBinFile,false);
    sVar5 = testDotFile._M_string_length;
    std::__cxx11::string::~string((string *)&testDotFile);
    if (sVar5 == 0) {
      poVar41 = std::operator<<((ostream *)&std::cerr,
                                "Problem with FindFile with system paths for: ");
      poVar41 = std::operator<<(poVar41,(string *)&buf);
      std::endl<char,std::char_traits<char>>(poVar41);
    }
    bVar4 = sVar5 != 0 && sVar49 != 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&testBinFile);
  }
  else {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with Touch for: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/foo",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/",(allocator<char> *)&testBinFile);
  bVar26 = cmsys::SystemTools::IsSubDirectory((string *)&buf,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  if (!bVar26) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with IsSubDirectory (root - unix): ");
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"c:/foo",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"c:/",(allocator<char> *)&testBinFile);
  bVar27 = cmsys::SystemTools::IsSubDirectory((string *)&buf,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  if (!bVar27) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with IsSubDirectory (root - dos): ");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar26 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/foo/bar",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/foo",(allocator<char> *)&testBinFile);
  bVar27 = cmsys::SystemTools::IsSubDirectory((string *)&buf,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  if (!bVar27) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with IsSubDirectory (deep): ");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar26 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/foo",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/foo",(allocator<char> *)&testBinFile);
  bVar27 = cmsys::SystemTools::IsSubDirectory((string *)&buf,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar27) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with IsSubDirectory (identity): ");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar26 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/fooo",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/foo",(allocator<char> *)&testBinFile);
  bVar27 = cmsys::SystemTools::IsSubDirectory((string *)&buf,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar27) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem with IsSubDirectory (substring): ");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar26 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/foo/",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"/foo",(allocator<char> *)&testBinFile);
  bVar27 = cmsys::SystemTools::IsSubDirectory((string *)&buf,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar27) {
    poVar41 = std::operator<<((ostream *)&std::cerr,
                              "Problem with IsSubDirectory (prepended slash): ");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar26 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/kwsys/README.rst"
             ,(allocator<char> *)&buf);
  std::ifstream::ifstream(&buf,testNonExistingFile._M_dataplus._M_p,_S_in);
  if ((*(byte *)((long)buf.__glibc_reserved + *(long *)(buf.st_dev - 0x18) + -0x58) & 5) == 0) {
    testDotFile._M_dataplus._M_p = (pointer)&testDotFile.field_2;
    testDotFile._M_string_length = 0;
    testDotFile.field_2._M_local_buf[0] = '\0';
    testBinFile._M_dataplus._M_p = testBinFile._M_dataplus._M_p & 0xffffffffffffff00;
    std::istream::seekg((long)&buf,_S_beg);
    bVar27 = cmsys::SystemTools::GetLineFromStream
                       ((istream *)&buf,&testDotFile,(bool *)&testBinFile,0xffffffffffffffff);
    if (bVar27 && testDotFile._M_string_length == 5) {
      std::istream::seekg((long)&buf,_S_beg);
      bVar27 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)&buf,&testDotFile,(bool *)&testBinFile,0xffffffffffffffff);
      if (!bVar27 || testDotFile._M_string_length != 5) {
        pcVar44 = "First line does not have five characters after rewind: ";
        goto LAB_0010a8a8;
      }
      local_4ac = 1;
      for (sVar49 = 1; sVar49 != 6; sVar49 = sVar49 + 1) {
        std::istream::seekg((long)&buf,_S_beg);
        bVar27 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)&buf,&testDotFile,(bool *)&testBinFile,sVar49);
        if (!bVar27 || sVar49 != testDotFile._M_string_length) {
          poVar41 = std::operator<<((ostream *)&std::cerr,"Should have read ");
          poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
          poVar41 = std::operator<<(poVar41," characters but got ");
          poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
          std::endl<char,std::char_traits<char>>(poVar41);
          local_4ac = 0;
        }
      }
    }
    else {
      pcVar44 = "First line does not have five characters: ";
LAB_0010a8a8:
      poVar41 = std::operator<<((ostream *)&std::cerr,pcVar44);
      poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
      std::endl<char,std::char_traits<char>>(poVar41);
      local_4ac = 0;
    }
    std::__cxx11::string::~string((string *)&testDotFile);
  }
  else {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem opening: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar41);
    local_4ac = 0;
  }
  std::ifstream::~ifstream(&buf);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"longlines.txt",(allocator<char> *)&buf);
  testDotFile._M_dataplus._M_p = (pointer)&testDotFile.field_2;
  testDotFile._M_string_length = 0;
  testDotFile.field_2._M_local_buf[0] = '\0';
  testBinFile._M_dataplus._M_p = (pointer)&testBinFile.field_2;
  testBinFile._M_string_length = 0;
  testBinFile.field_2._M_allocated_capacity =
       testBinFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::assign((ulong)&testDotFile,'\x02');
  std::__cxx11::string::append((char *)&testDotFile);
  std::__cxx11::string::assign((ulong)&testBinFile,'\x02');
  std::__cxx11::string::append((char *)&testBinFile);
  std::ofstream::ofstream(&buf,testNonExistingFile._M_dataplus._M_p,_S_bin);
  uVar3 = *(uint *)((long)buf.__glibc_reserved + *(long *)(buf.st_dev - 0x18) + -0x58);
  if ((uVar3 & 5) == 0) {
    poVar41 = std::operator<<((ostream *)&buf,(string *)&testDotFile);
    poVar41 = std::operator<<(poVar41,"\r\n\n");
    poVar41 = std::operator<<(poVar41,(string *)&testBinFile);
    std::operator<<(poVar41,"\n");
  }
  else {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Problem opening for write: ");
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  std::ofstream::~ofstream(&buf);
  if ((uVar3 & 5) == 0) {
    std::ifstream::ifstream(&buf,testNonExistingFile._M_dataplus._M_p,_S_bin);
    if ((*(byte *)((long)buf.__glibc_reserved + *(long *)(buf.st_dev - 0x18) + -0x58) & 5) == 0) {
      testTxtFile._M_dataplus._M_p = (pointer)&testTxtFile.field_2;
      testTxtFile._M_string_length = 0;
      testTxtFile.field_2._M_allocated_capacity =
           testTxtFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
      testNewDir._M_dataplus._M_p = testNewDir._M_dataplus._M_p & 0xffffffffffffff00;
      bVar27 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)&buf,&testTxtFile,(bool *)&testNewDir,0xffffffffffffffff);
      if ((!bVar27) || (bVar27 = std::operator!=(&testTxtFile,&testDotFile), bVar27)) {
        poVar41 = std::operator<<((ostream *)&std::cerr,"First line does not match, expected ");
LAB_0010ab07:
        poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
        poVar41 = std::operator<<(poVar41," characters, got ");
        poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
LAB_0010ac28:
        std::endl<char,std::char_traits<char>>(poVar41);
        local_4a0 = 0;
      }
      else {
        if ((char)testNewDir._M_dataplus._M_p != '\x01') {
          pcVar44 = "Expected new line to be read from first line";
LAB_0010ac1b:
          poVar41 = std::operator<<(local_4a8,pcVar44);
          goto LAB_0010ac28;
        }
        testNewDir._M_dataplus._M_p = testNewDir._M_dataplus._M_p & 0xffffffffffffff00;
        bVar27 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)&buf,&testTxtFile,(bool *)&testNewDir,0xffffffffffffffff);
        if (!bVar27 || testTxtFile._M_string_length != 0) {
          poVar41 = std::operator<<((ostream *)&std::cerr,
                                    "Expected successful read with an empty line, got ");
          local_4a8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar41);
          pcVar44 = " characters";
          goto LAB_0010ac1b;
        }
        if ((char)testNewDir._M_dataplus._M_p != '\x01') {
          pcVar44 = "Expected new line to be read for an empty line";
          goto LAB_0010ac1b;
        }
        testNewDir._M_dataplus._M_p = testNewDir._M_dataplus._M_p & 0xffffffffffffff00;
        bVar27 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)&buf,&testTxtFile,(bool *)&testNewDir,0xffffffffffffffff);
        if ((!bVar27) || (bVar27 = std::operator!=(&testTxtFile,&testBinFile), bVar27)) {
          poVar41 = std::operator<<((ostream *)&std::cerr,"Second line does not match, expected ");
          goto LAB_0010ab07;
        }
        local_4a0 = 1;
        if ((char)testNewDir._M_dataplus._M_p == '\0') {
          pcVar44 = "Expected new line to be read from second line";
          goto LAB_0010ac1b;
        }
      }
      std::__cxx11::string::~string((string *)&testTxtFile);
    }
    else {
      poVar41 = std::operator<<((ostream *)&std::cerr,"Problem opening: ");
      poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
      std::endl<char,std::char_traits<char>>(poVar41);
      local_4a0 = 0;
    }
    std::ifstream::~ifstream(&buf);
  }
  else {
    local_4a0 = 0;
  }
  std::__cxx11::string::~string((string *)&testBinFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"C:\\somewhere\\something",(allocator<char> *)&testNonExistingFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNonExistingFile,"something",(allocator<char> *)&testDotFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testBinFile,"C:\\somewhere\\something",(allocator<char> *)&testTxtFile);
  cmsys::SystemTools::GetFilenameName(&testDotFile,&testBinFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  bVar27 = std::operator!=(&testDotFile,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf
                          );
  if (bVar27) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"GetFilenameName(");
    poVar41 = std::operator<<(poVar41,"C:\\somewhere\\something");
    poVar41 = std::operator<<(poVar41,") yielded ");
    poVar41 = std::operator<<(poVar41,(string *)&testDotFile);
    poVar41 = std::operator<<(poVar41," instead of ");
    poVar41 = std::operator<<(poVar41,(string *)&buf);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testTxtFile,"/somewhere/something",(allocator<char> *)&testNewDir);
  cmsys::SystemTools::GetFilenameName(&testBinFile,&testTxtFile);
  std::__cxx11::string::operator=((string *)&testDotFile,(string *)&testBinFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  std::__cxx11::string::~string((string *)&testTxtFile);
  bVar28 = std::operator!=(&testDotFile,&testNonExistingFile);
  if (bVar28) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"GetFilenameName(");
    poVar41 = std::operator<<(poVar41,"/somewhere/something");
    poVar41 = std::operator<<(poVar41,") yielded ");
    poVar41 = std::operator<<(poVar41,(string *)&testDotFile);
    poVar41 = std::operator<<(poVar41," instead of ");
    poVar41 = std::operator<<(poVar41,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar41);
  }
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  pbVar50 = &diff_test_cases[0].differ;
  uVar46 = 0;
  while( true ) {
    if (((uVar46 == 9) ||
        (bVar29 = writeFile("file_a",((anon_struct_24_3_dff52ec8 *)(pbVar50 + -0x10))->a), !bVar29))
       || (bVar29 = writeFile("file_b",*(char **)(pbVar50 + -8)), !bVar29)) goto LAB_0010af66;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"file_a",(allocator<char> *)&testDotFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testNonExistingFile,"file_b",(allocator<char> *)&testBinFile);
    bVar30 = cmsys::SystemTools::TextFilesDiffer((string *)&buf,&testNonExistingFile);
    bVar29 = *pbVar50;
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&buf);
    if (bVar29 != bVar30) break;
    uVar46 = uVar46 + 1;
    pbVar50 = pbVar50 + 0x18;
  }
  poVar41 = std::operator<<((ostream *)&std::cerr,"Incorrect TextFilesDiffer result for test case ")
  ;
  poVar41 = (ostream *)std::ostream::operator<<(poVar41,(int)uVar46 + 1);
  poVar41 = std::operator<<(poVar41,".");
  std::endl<char,std::char_traits<char>>(poVar41);
LAB_0010af66:
  bVar53 = 1;
  uVar51 = 0;
  while (uVar51 != 9) {
    pcVar44 = diff_test_cases[uVar51].a;
    bVar29 = writeFile("file_a",pcVar44);
    if ((!bVar29) || (bVar29 = writeFile("file_b",diff_test_cases[uVar51].b), !bVar29)) {
      bVar53 = 0;
      goto LAB_0010b220;
    }
    __s = "file_b";
    if (uVar51 < 4) {
      __s = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O2/Source/kwsys/file_b"
      ;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"file_a",(allocator<char> *)&testDotFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testNonExistingFile,__s,(allocator<char> *)&testBinFile);
    CVar66 = cmsys::SystemTools::CopyFileIfDifferent((string *)&buf,&testNonExistingFile);
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&buf);
    if (CVar66.super_Status.Kind_ == Success) {
      std::ifstream::ifstream(&buf,__s,_S_bin);
      std::__cxx11::stringstream::stringstream((stringstream *)&testNonExistingFile);
      std::ostream::operator<<(&testNonExistingFile.field_2,(streambuf *)&buf.st_nlink);
      paVar1 = &testBinFile.field_2;
      std::__cxx11::stringbuf::str();
      if ((*(byte *)((long)buf.__glibc_reserved + *(long *)(buf.st_dev - 0x18) + -0x58) & 5) == 0) {
        paVar47 = &testDotFile.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)testDotFile._M_dataplus._M_p == paVar47) {
          testBinFile.field_2._8_8_ = testDotFile.field_2._8_8_;
          testBinFile._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          testBinFile._M_dataplus = testDotFile._M_dataplus;
        }
        testBinFile.field_2._M_allocated_capacity._1_7_ =
             testDotFile.field_2._M_allocated_capacity._1_7_;
        testBinFile.field_2._M_local_buf[0] = testDotFile.field_2._M_local_buf[0];
        testBinFile._M_string_length = testDotFile._M_string_length;
        psVar48 = &testDotFile;
        testDotFile._M_dataplus._M_p = (pointer)paVar47;
      }
      else {
        poVar41 = std::operator<<((ostream *)&std::cerr,"Failed to read file: ");
        poVar41 = std::operator<<(poVar41,__s);
        std::endl<char,std::char_traits<char>>(poVar41);
        psVar48 = &testBinFile;
        paVar47 = paVar1;
        testBinFile._M_dataplus._M_p = (pointer)paVar1;
      }
      psVar48->_M_string_length = 0;
      paVar47->_M_local_buf[0] = '\0';
      std::__cxx11::string::~string((string *)&testDotFile);
      std::__cxx11::stringstream::~stringstream((stringstream *)&testNonExistingFile);
      std::ifstream::~ifstream(&buf);
      bVar29 = std::operator!=(pcVar44,&testBinFile);
      if (bVar29) {
        poVar41 = std::operator<<((ostream *)&std::cerr,
                                  "Incorrect CopyFileIfDifferent file contents in test case ");
        poVar41 = (ostream *)std::ostream::operator<<(poVar41,(int)uVar51 + 1);
        poVar41 = std::operator<<(poVar41,".");
        std::endl<char,std::char_traits<char>>(poVar41);
        bVar53 = 0;
      }
      uVar51 = uVar51 + 1;
      std::__cxx11::string::~string((string *)&testBinFile);
    }
    else {
      poVar41 = std::operator<<((ostream *)&std::cerr,
                                "CopyFileIfDifferent() returned false for test case ");
      uVar51 = uVar51 + 1;
      poVar41 = (ostream *)std::ostream::operator<<(poVar41,(int)uVar51);
      poVar41 = std::operator<<(poVar41,".");
      bVar53 = 0;
      std::endl<char,std::char_traits<char>>(poVar41);
    }
  }
  SVar43 = cmsys::SystemTools::MakeDirectory("dir_a",(mode_t *)0x0);
  if ((SVar43.Kind_ == Success) &&
     (SVar43 = cmsys::SystemTools::MakeDirectory("dir_b",(mode_t *)0x0), SVar43.Kind_ == Success)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"dir_a/",(allocator<char> *)&testDotFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testNonExistingFile,"dir_b",(allocator<char> *)&testBinFile);
    CVar66 = cmsys::SystemTools::CopyFileIfDifferent((string *)&buf,&testNonExistingFile);
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&buf);
    bVar53 = CVar66.super_Status.Kind_ == Success & bVar53;
  }
  else {
    bVar53 = 0;
  }
LAB_0010b220:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"https://user:pw@hostname:42/full/url.com",
             (allocator<char> *)&testNonExistingFile);
  testNonExistingFile._M_dataplus._M_p = (pointer)&testNonExistingFile.field_2;
  testNonExistingFile._M_string_length = 0;
  testDotFile._M_dataplus._M_p = (pointer)&testDotFile.field_2;
  testDotFile._M_string_length = 0;
  testBinFile._M_dataplus._M_p = (pointer)&testBinFile.field_2;
  testBinFile._M_string_length = 0;
  testTxtFile._M_dataplus._M_p = (pointer)&testTxtFile.field_2;
  testTxtFile._M_string_length = 0;
  testDotFile.field_2._M_local_buf[0] = '\0';
  testBinFile.field_2._M_allocated_capacity =
       testBinFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testTxtFile.field_2._M_allocated_capacity =
       testTxtFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testNewDir._M_dataplus._M_p = (pointer)&testNewDir.field_2;
  testNewDir._M_string_length = 0;
  testNonExistingFile.field_2._M_allocated_capacity =
       testNonExistingFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testNewDir.field_2._M_local_buf[0] = '\0';
  testNewFile._M_dataplus._M_p = (pointer)&testNewFile.field_2;
  testNewFile._M_string_length = 0;
  testNewFile.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::ParseURL
            ((string *)&buf,&testNonExistingFile,&testDotFile,&testBinFile,&testTxtFile,&testNewDir,
             &testNewFile,false);
  bVar29 = std::operator!=(&testNonExistingFile,"https");
  if ((((!bVar29) && (bVar29 = std::operator!=(&testDotFile,"user"), !bVar29)) &&
      (bVar29 = std::operator!=(&testBinFile,"pw"), !bVar29)) &&
     ((bVar29 = std::operator!=(&testTxtFile,"hostname"), !bVar29 &&
      (bVar29 = std::operator!=(&testNewDir,"42"), !bVar29)))) {
    bVar29 = std::operator!=(&testNewFile,"full/url.com");
    bVar52 = 1;
    if (!bVar29) goto LAB_0010b387;
  }
  poVar41 = std::operator<<((ostream *)&std::cerr,"Incorrect URL parsing");
  std::endl<char,std::char_traits<char>>(poVar41);
  bVar52 = 0;
LAB_0010b387:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testFileMissing,
             "file://hostname/path/to/a%20file%20with%20str%C3%A0ng%C3%A8%20ch%40r%20and%20s%C2%B5aces"
             ,(allocator<char> *)&testFileMissingDir);
  psVar48 = &testNewFile;
  cmsys::SystemTools::ParseURL
            (&testFileMissing,&testNonExistingFile,&testDotFile,&testBinFile,&testTxtFile,
             &testNewDir,psVar48,true);
  bVar29 = std::operator!=(&testNonExistingFile,"file");
  if (((bVar29) || (bVar29 = std::operator!=(&testTxtFile,"hostname"), bVar29)) ||
     (bVar29 = std::operator!=(&testNewFile,anon_var_dwarf_822f), bVar29)) {
    poVar41 = std::operator<<((ostream *)&std::cerr,"Incorrect URL parsing or decoding");
    std::endl<char,std::char_traits<char>>(poVar41);
    bVar52 = 0;
  }
  std::__cxx11::string::~string((string *)&testFileMissing);
  std::__cxx11::string::~string((string *)&testNewFile);
  std::__cxx11::string::~string((string *)&testNewDir);
  std::__cxx11::string::~string((string *)&testTxtFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"nosep",(allocator<char> *)&testDotFile);
  testNonExistingFile._M_dataplus._M_p = "nosep";
  expected._M_len = (size_type)psVar48;
  expected._M_array = (iterator)0x1;
  bVar29 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&buf,&testNonExistingFile,expected);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"first/second",(allocator<char> *)&testDotFile);
  testNonExistingFile._M_dataplus._M_p = "first";
  testNonExistingFile._M_string_length = (long)"first/second" + 6;
  expected_00._M_len = (size_type)"second";
  expected_00._M_array = (iterator)0x2;
  pcVar44 = "second";
  bVar30 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&buf,&testNonExistingFile,expected_00);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"/starts/sep",(allocator<char> *)&testDotFile);
  testNonExistingFile.field_2._M_allocated_capacity = (long)"/starts/sep" + 8;
  testNonExistingFile._M_dataplus._M_p = "";
  testNonExistingFile._M_string_length = (size_type)anon_var_dwarf_8283;
  expected_01._M_len = (size_type)pcVar44;
  expected_01._M_array = (iterator)0x3;
  bVar31 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&buf,&testNonExistingFile,expected_01);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"ends/sep/",(allocator<char> *)&testDotFile);
  testNonExistingFile.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_809b;
  testNonExistingFile._M_dataplus._M_p = "ends";
  testNonExistingFile._M_string_length = (long)"/starts/sep" + 8;
  expected_02._M_len = (size_type)pcVar44;
  expected_02._M_array = (iterator)0x3;
  bVar32 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&buf,&testNonExistingFile,expected_02);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::~string((string *)&output);
  return (uint)(byte)(local_59d &
                      8 < uVar46 & bVar53 & bVar52 & ((bVar31 && bVar32) && (bVar29 && bVar30)) &
                      bVar6 & bVar55 &
                      (((bVar9 && bVar10) && bVar59) && ((bVar8 && bVar58) && (bVar57 && bVar7))) &
                      (((bVar11 && bVar12) && (bVar60 && bVar61)) && bVar13) &
                      ((((bVar62 && bVar63) && bVar64) && bVar65) &&
                      ((((bVar21 && bVar22) && bVar23) && bVar24) &&
                      (((bVar18 && bVar19) && bVar20) && ((bVar16 && bVar17) && (bVar14 && bVar15)))
                      )) & bVar56 & bVar25 & bVar4 & bVar26 & local_4ac & local_4a0 &
                           (!bVar28 && !bVar27) ^ 1);
}

Assistant:

int testSystemTools(int, char*[])
{
  bool res = true;

  int cc;
  for (cc = 0; toUnixPaths[cc][0]; cc++) {
    res &= CheckConvertToUnixSlashes(toUnixPaths[cc][0], toUnixPaths[cc][1]);
  }

  // Special check for ~
  std::string output;
  if (kwsys::SystemTools::GetEnv("HOME", output)) {
    output += "/foo bar/lala";
    res &= CheckConvertToUnixSlashes("~/foo bar/lala", output);
  }

  for (cc = 0; checkEscapeChars[cc][0]; cc++) {
    res &= CheckEscapeChars(checkEscapeChars[cc][0], checkEscapeChars[cc][1],
                            *checkEscapeChars[cc][2], checkEscapeChars[cc][3]);
  }

  res &= CheckFileOperations();

  res &= CheckStringOperations();

  res &= CheckEnvironmentOperations();

  res &= CheckRelativePaths();

  res &= CheckCollapsePath();

  res &= CheckGetPath();

  res &= CheckFind();

  res &= CheckIsSubDirectory();

  res &= CheckGetLineFromStream();

  res &= CheckGetLineFromStreamLongLine();

  res &= CheckGetFilenameName();

  res &= CheckTextFilesDiffer();

  res &= CheckCopyFileIfDifferent();

  res &= CheckURLParsing();

  res &= CheckSplitString();

  return res ? 0 : 1;
}